

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O1

string * __thiscall
duckdb::BindContext::AmbiguityException_abi_cxx11_
          (string *__return_storage_ptr__,BindContext *this,BindingAlias *alias,
          vector<std::reference_wrapper<duckdb::Binding>,_true> *bindings)

{
  bool bVar1;
  const_reference pvVar2;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ulong __n;
  bool bVar5;
  ulong __n_00;
  BindingAlias *other;
  BindingAlias *this_00;
  string new_minimum_alias;
  string minimum_alias;
  undefined1 local_c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  BindContext *local_78;
  _Alloc_hider local_70;
  long local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  bool bVar6;
  
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  local_78 = this;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(use: ","");
  if ((pointer)(alias->catalog)._M_string_length != (alias->catalog)._M_dataplus._M_p) {
    __n_00 = 0;
    do {
      if (__n_00 != 0) {
        bindings = (vector<std::reference_wrapper<duckdb::Binding>,_true> *)(__n_00 + 1);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pvVar2 = vector<std::reference_wrapper<duckdb::Binding>,_true>::operator[]
                         ((vector<std::reference_wrapper<duckdb::Binding>,_true> *)alias,__n_00);
      local_a0._M_allocated_capacity = (size_type)local_90;
      local_a0._8_8_ = 0;
      local_90[0] = 0;
      if ((pointer)(alias->catalog)._M_string_length == (alias->catalog)._M_dataplus._M_p) {
LAB_0074d26b:
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,local_a0._M_allocated_capacity);
      }
      else {
        this_00 = &pvVar2->_M_data->alias;
        __n = 0;
        bVar6 = false;
        bVar5 = false;
        do {
          if (__n_00 != __n) {
            pvVar2 = vector<std::reference_wrapper<duckdb::Binding>,_true>::operator[]
                               ((vector<std::reference_wrapper<duckdb::Binding>,_true> *)alias,__n);
            other = &pvVar2->_M_data->alias;
            bVar1 = BindingAlias::operator==(this_00,other);
            bVar5 = bVar6;
            if (bVar1) {
              bVar5 = true;
            }
            MinimumUniqueAlias_abi_cxx11_
                      ((string *)local_c0,(duckdb *)this_00,other,(BindingAlias *)bindings);
            if ((ulong)local_a0._8_8_ < (ulong)local_c0._8_8_) {
              ::std::__cxx11::string::operator=((string *)local_a0._M_local_buf,(string *)local_c0);
            }
            bVar6 = bVar5;
            if ((BindingAlias *)local_c0._0_8_ != (BindingAlias *)(local_c0 + 0x10)) {
              operator_delete((void *)local_c0._0_8_);
            }
          }
          __n = __n + 1;
        } while (__n < (ulong)((long)((alias->catalog)._M_string_length -
                                     (long)(alias->catalog)._M_dataplus._M_p) >> 3));
        if (!bVar5) goto LAB_0074d26b;
        BindingAlias::ToString_abi_cxx11_(&local_50,(BindingAlias *)local_78);
        plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1391704);
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 == paVar4) {
          local_60._M_allocated_capacity = paVar4->_M_allocated_capacity;
          local_60._8_8_ = plVar3[3];
          local_70._M_p = (pointer)&local_60;
        }
        else {
          local_60._M_allocated_capacity = paVar4->_M_allocated_capacity;
          local_70._M_p = (pointer)*plVar3;
        }
        local_68 = plVar3[1];
        *plVar3 = (long)paVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)::std::__cxx11::string::append((char *)&local_70);
        bindings = (vector<std::reference_wrapper<duckdb::Binding>,_true> *)(plVar3 + 2);
        if ((BindingAlias *)*plVar3 == (BindingAlias *)bindings) {
          local_c0._16_8_ =
               (((_Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                  *)&(((BindingAlias *)bindings)->catalog)._M_dataplus)->_M_impl).
               super__Vector_impl_data._M_start;
          local_c0._24_8_ = plVar3[3];
          local_c0._0_8_ = (BindingAlias *)(local_c0 + 0x10);
        }
        else {
          local_c0._16_8_ =
               (((_Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                  *)&(((BindingAlias *)bindings)->catalog)._M_dataplus)->_M_impl).
               super__Vector_impl_data._M_start;
          local_c0._0_8_ = (BindingAlias *)*plVar3;
        }
        local_c0._8_8_ = plVar3[1];
        *plVar3 = (long)bindings;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_c0);
        if ((BindingAlias *)local_c0._0_8_ != (BindingAlias *)(local_c0 + 0x10)) {
          operator_delete((void *)local_c0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      if ((undefined1 *)local_a0._M_allocated_capacity != local_90) {
        operator_delete((void *)local_a0._M_allocated_capacity);
      }
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)((long)((alias->catalog)._M_string_length -
                                    (long)(alias->catalog)._M_dataplus._M_p) >> 3));
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string BindContext::AmbiguityException(const BindingAlias &alias, const vector<reference<Binding>> &bindings) {
	D_ASSERT(bindings.size() > 1);
	// found multiple matching aliases
	string result = "(use: ";
	for (idx_t i = 0; i < bindings.size(); i++) {
		if (i > 0) {
			if (i + 1 == bindings.size()) {
				result += " or ";
			} else {
				result += ", ";
			}
		}
		// find the minimum alias that uniquely describes this table reference
		auto &current_alias = bindings[i].get().alias;
		string minimum_alias;
		bool duplicate_alias = false;
		for (idx_t k = 0; k < bindings.size(); k++) {
			if (k == i) {
				continue;
			}
			auto &other_alias = bindings[k].get().alias;
			if (current_alias == other_alias) {
				duplicate_alias = true;
			}
			string new_minimum_alias = MinimumUniqueAlias(current_alias, other_alias);
			if (new_minimum_alias.size() > minimum_alias.size()) {
				minimum_alias = std::move(new_minimum_alias);
			}
		}
		if (duplicate_alias) {
			result = "(duplicate alias \"" + alias.ToString() +
			         "\", explicitly alias one of the tables using \"AS my_alias\"";
		} else {
			result += minimum_alias;
		}
	}
	result += ")";
	return result;
}